

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O0

string * __thiscall
google::protobuf::internal::ArenaStringPtr::MutableSlow<google::protobuf::internal::LazyString>
          (ArenaStringPtr *this,Arena *arena,LazyString *lazy_default)

{
  string *psVar1;
  size_t in_RSI;
  ArenaImpl *in_RDI;
  string *new_string;
  string *default_value;
  size_t n;
  LazyString *in_stack_fffffffffffffeb8;
  ArenaImpl *in_stack_fffffffffffffec0;
  _func_void_void_ptr *in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffed8;
  undefined8 local_40;
  
  psVar1 = LazyString::get_abi_cxx11_(in_stack_fffffffffffffeb8);
  if (in_RSI == 0) {
    local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(0x20);
    std::__cxx11::string::string((string *)local_40,(string *)psVar1);
  }
  else {
    AlignUpTo8(0x20);
    ArenaImpl::RecordAlloc(in_stack_fffffffffffffec0,(type_info *)in_stack_fffffffffffffeb8,in_RSI);
    local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ArenaImpl::AllocateAlignedAndAddCleanup
                         (in_RDI,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    std::__cxx11::string::string((string *)local_40,(string *)psVar1);
  }
  TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Set
            ((TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_RDI,local_40);
  return local_40;
}

Assistant:

std::string* ArenaStringPtr::MutableSlow(::google::protobuf::Arena* arena,
                                         const Lazy&... lazy_default) {
  const std::string* const default_value =
      sizeof...(Lazy) == 0 ? &GetEmptyStringAlreadyInited() : nullptr;
  GOOGLE_DCHECK(IsDefault(default_value));
  std::string* new_string =
      Arena::Create<std::string>(arena, lazy_default.get()...);
  tagged_ptr_.Set(new_string);
  return new_string;
}